

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

int Cudd_SetVarMap(DdManager *manager,DdNode **x,DdNode **y,int n)

{
  int *piVar1;
  int local_30;
  int i;
  int n_local;
  DdNode **y_local;
  DdNode **x_local;
  DdManager *manager_local;
  
  if (manager->map == (int *)0x0) {
    piVar1 = (int *)malloc((long)manager->maxSize << 2);
    manager->map = piVar1;
    if (manager->map == (int *)0x0) {
      manager->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    manager->memused = (long)manager->maxSize * 4 + manager->memused;
  }
  else {
    cuddCacheFlush(manager);
  }
  for (local_30 = 0; local_30 < manager->size; local_30 = local_30 + 1) {
    manager->map[local_30] = local_30;
  }
  for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
    manager->map[x[local_30]->index] = y[local_30]->index;
    manager->map[y[local_30]->index] = x[local_30]->index;
  }
  return 1;
}

Assistant:

int
Cudd_SetVarMap (
  DdManager *manager /* DD manager */,
  DdNode **x /* first array of variables */,
  DdNode **y /* second array of variables */,
  int n /* length of both arrays */)
{
    int i;

    if (manager->map != NULL) {
        cuddCacheFlush(manager);
    } else {
        manager->map = ABC_ALLOC(int,manager->maxSize);
        if (manager->map == NULL) {
            manager->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        manager->memused += sizeof(int) * manager->maxSize;
    }
    /* Initialize the map to the identity. */
    for (i = 0; i < manager->size; i++) {
        manager->map[i] = i;
    }
    /* Create the map. */
    for (i = 0; i < n; i++) {
        manager->map[x[i]->index] = y[i]->index;
        manager->map[y[i]->index] = x[i]->index;
    }
    return(1);

}